

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

void llvm::sys::path::native(SmallVectorImpl<char> *Path,Style style)

{
  bool bVar1;
  Style SVar2;
  iterator pcVar3;
  iterator __last;
  reference pcVar4;
  size_t sVar5;
  iterator PN;
  iterator PE;
  iterator PI;
  SmallVectorBase *pSStack_10;
  Style style_local;
  SmallVectorImpl<char> *Path_local;
  
  PI._4_4_ = style;
  pSStack_10 = (SmallVectorBase *)Path;
  bVar1 = SmallVectorBase::empty((SmallVectorBase *)Path);
  if (!bVar1) {
    SVar2 = anon_unknown.dwarf_2a5bf16::real_style(PI._4_4_);
    if (SVar2 == windows) {
      pcVar3 = SmallVectorTemplateCommon<char,_void>::begin
                         ((SmallVectorTemplateCommon<char,_void> *)pSStack_10);
      __last = SmallVectorTemplateCommon<char,_void>::end
                         ((SmallVectorTemplateCommon<char,_void> *)pSStack_10);
      PI._3_1_ = 0x2f;
      PI._2_1_ = 0x5c;
      std::replace<char*,char>(pcVar3,__last,(char *)((long)&PI + 3),(char *)((long)&PI + 2));
      pcVar4 = SmallVectorTemplateCommon<char,_void>::operator[]
                         ((SmallVectorTemplateCommon<char,_void> *)pSStack_10,0);
      if (*pcVar4 == '~') {
        sVar5 = SmallVectorBase::size(pSStack_10);
        if (sVar5 != 1) {
          pcVar4 = SmallVectorTemplateCommon<char,_void>::operator[]
                             ((SmallVectorTemplateCommon<char,_void> *)pSStack_10,1);
          bVar1 = is_separator(*pcVar4,PI._4_4_);
          if (!bVar1) {
            return;
          }
        }
        llvm_unreachable_internal
                  ("BINARYEN native",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/Path.cpp"
                   ,0x1ed);
      }
    }
    else {
      PE = SmallVectorTemplateCommon<char,_void>::begin
                     ((SmallVectorTemplateCommon<char,_void> *)pSStack_10);
      pcVar3 = SmallVectorTemplateCommon<char,_void>::end
                         ((SmallVectorTemplateCommon<char,_void> *)pSStack_10);
      for (; PE < pcVar3; PE = PE + 1) {
        if (*PE == '\\') {
          if ((PE + 1 < pcVar3) && (PE[1] == '\\')) {
            PE = PE + 1;
          }
          else {
            *PE = '/';
          }
        }
      }
    }
  }
  return;
}

Assistant:

void native(SmallVectorImpl<char> &Path, Style style) {
  if (Path.empty())
    return;
  if (real_style(style) == Style::windows) {
    std::replace(Path.begin(), Path.end(), '/', '\\');
    if (Path[0] == '~' && (Path.size() == 1 || is_separator(Path[1], style))) {
      llvm_unreachable("BINARYEN native");
#if 0
      SmallString<128> PathHome;
      home_directory(PathHome);
      PathHome.append(Path.begin() + 1, Path.end());
      Path = PathHome;
#endif
    }
  } else {
    for (auto PI = Path.begin(), PE = Path.end(); PI < PE; ++PI) {
      if (*PI == '\\') {
        auto PN = PI + 1;
        if (PN < PE && *PN == '\\')
          ++PI; // increment once, the for loop will move over the escaped slash
        else
          *PI = '/';
      }
    }
  }
}